

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::getNCName(XMLReader *this,XMLBuffer *toFill)

{
  bool bVar1;
  XMLSize_t XVar2;
  XMLSize_t count;
  XMLSize_t charIndex_start;
  XMLBuffer *toFill_local;
  XMLReader *this_local;
  
  if ((this->fCharIndex != this->fCharsAvail) || (bVar1 = refreshCharBuffer(this), bVar1)) {
    count = this->fCharIndex;
    if (((ushort)this->fCharBuf[this->fCharIndex] < 0xd800) ||
       (0xdb7f < (ushort)this->fCharBuf[this->fCharIndex])) {
      bVar1 = isFirstNCNameChar(this,this->fCharBuf[this->fCharIndex]);
      if (!bVar1) {
        return false;
      }
      this->fCharIndex = this->fCharIndex + 1;
    }
    else {
      if (this->fCharIndex + 1 == this->fCharsAvail) {
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) {
          return false;
        }
        count = this->fCharIndex;
      }
      if (((ushort)this->fCharBuf[this->fCharIndex + 1] < 0xdc00) ||
         (0xdfff < (ushort)this->fCharBuf[this->fCharIndex + 1])) {
        return false;
      }
      this->fCharIndex = this->fCharIndex + 2;
    }
    do {
      if (this->fCharIndex == this->fCharsAvail) {
        XVar2 = this->fCharIndex - count;
        if (XVar2 != 0) {
          this->fCurCol = XVar2 + this->fCurCol;
          XMLBuffer::append(toFill,this->fCharBuf + count,XVar2);
        }
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) {
          return true;
        }
        count = this->fCharIndex;
      }
      while (this->fCharIndex < this->fCharsAvail) {
        if (((ushort)this->fCharBuf[this->fCharIndex] < 0xd800) ||
           (0xdb7f < (ushort)this->fCharBuf[this->fCharIndex])) {
          bVar1 = isNCNameChar(this,this->fCharBuf[this->fCharIndex]);
          if (!bVar1) break;
          this->fCharIndex = this->fCharIndex + 1;
        }
        else {
          if (this->fCharIndex + 1 == this->fCharsAvail) {
            if (this->fCharIndex != count) {
              this->fCurCol = (this->fCharIndex - count) + this->fCurCol;
              XMLBuffer::append(toFill,this->fCharBuf + count,this->fCharIndex - count);
            }
            bVar1 = refreshCharBuffer(this);
            if (!bVar1) break;
            count = this->fCharIndex;
          }
          if (((ushort)this->fCharBuf[this->fCharIndex + 1] < 0xdc00) ||
             (0xdfff < (ushort)this->fCharBuf[this->fCharIndex + 1])) break;
          this->fCharIndex = this->fCharIndex + 2;
        }
      }
    } while (this->fCharIndex == this->fCharsAvail);
    XVar2 = this->fCharIndex - count;
    if (XVar2 != 0) {
      this->fCurCol = XVar2 + this->fCurCol;
      XMLBuffer::append(toFill,this->fCharBuf + count,XVar2);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLReader::getNCName(XMLBuffer& toFill)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    XMLSize_t charIndex_start = fCharIndex, count;
    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
        // if there isn't one more char in the buffer, read more data
        if (fCharIndex+1 == fCharsAvail)
        {
            if (!refreshCharBuffer())
                return false;
            // reset the start buffer to the new location of the cursor
            charIndex_start = fCharIndex;
        }
        if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
            return false;

        // Looks ok, so lets eat it
        fCharIndex += 2;
    }
    else {
        if (!isFirstNCNameChar(fCharBuf[fCharIndex])) {
            return false;
        }

        // Looks ok, so lets eat it
        fCharIndex++;
    }

    do
    {
        if (fCharIndex == fCharsAvail)
        {
            // we have to copy the accepted character(s), and update the column number,
            // before getting new data and losing the value of fCharIndex
            if((count = fCharIndex - charIndex_start)!=0)
            {
                fCurCol += (XMLFileLoc)count;
                toFill.append(&fCharBuf[charIndex_start], count);
            }
            if(!refreshCharBuffer())
                return true;
            charIndex_start = fCharIndex;
        }

        //  Check the current char and take it if it's a name char
        while(fCharIndex < fCharsAvail)
        {
            if((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F))
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                    (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;
            }
            else if(isNCNameChar(fCharBuf[fCharIndex])) fCharIndex++;
            else break;
        }
        // if we didn't consume the entire buffer, we are done
    } while(fCharIndex == fCharsAvail);

    // we have to copy the accepted character(s), and update column
    if((count = fCharIndex - charIndex_start)!=0)
    {
        fCurCol += (XMLFileLoc)count;
        toFill.append(&fCharBuf[charIndex_start], count);
    }
    return true;
}